

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O2

string * __thiscall
cpp_client::Base_game::get_alias_abi_cxx11_
          (string *__return_storage_ptr__,Base_game *this,char *name,char *server,int port)

{
  bool bVar1;
  ostream *poVar2;
  Type this_00;
  size_t __n;
  char *name_00;
  void *__buf;
  Connection conn;
  string resp;
  string local_d0;
  string alias;
  Document doc;
  
  Connection::Connection(&conn,false);
  __n = 0;
  Connection::connect(&conn,(int)name,(sockaddr *)((ulong)server & 0xffffffff),0);
  std::__cxx11::string::string((string *)&resp,(char *)this,(allocator *)&local_d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&doc,
                 "{\"event\": \"alias\", \"data\": \"",&resp);
  std::operator+(&alias,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&doc,
                 "\"}");
  std::__cxx11::string::~string((string *)&doc);
  std::__cxx11::string::~string((string *)&resp);
  Connection::send(&conn,(int)&alias,__buf,__n,port);
  Connection::recieve_abi_cxx11_(&resp,&conn);
  name_00 = (char *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&doc,resp._M_dataplus._M_p);
  attr_wrapper::get_attribute<std::__cxx11::string>
            (&local_d0,(attr_wrapper *)&doc,(Value *)"event",name_00);
  bVar1 = std::operator==(&local_d0,"fatal");
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    attr_wrapper::get_attribute<std::__cxx11::string>
              (__return_storage_ptr__,(attr_wrapper *)&doc,(Value *)"data",name_00);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&doc);
    std::__cxx11::string::~string((string *)&resp);
    std::__cxx11::string::~string((string *)&alias);
    Connection::~Connection(&conn);
    return __return_storage_ptr__;
  }
  poVar2 = ::operator<<((ostream *)&std::cout,text_red);
  poVar2 = std::operator<<(poVar2,"Fatal: ");
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)&doc,"data");
  attr_wrapper::get_attribute<std::__cxx11::string>
            (&local_d0,(attr_wrapper *)this_00,(Value *)"message",name_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2,'\n');
  ::operator<<(poVar2,normal);
  std::__cxx11::string::~string((string *)&local_d0);
  exit(1);
}

Assistant:

std::string Base_game::get_alias(const char* name, const char* server, int port)
{
   Connection conn;
   conn.connect(server, port, false);
   std::string alias = R"({"event": "alias", "data": ")" + std::string(name) + "\"}";
   conn.send(alias);
   const auto resp = conn.recieve();
   rapidjson::Document doc;
   doc.Parse(resp.c_str());
   if(attr_wrapper::get_attribute<std::string>(doc, "event") == "fatal")
   {
      std::cout << sgr::text_red << "Fatal: "
                << attr_wrapper::get_attribute<std::string>(doc["data"], "message") << '\n'
                << sgr::reset;
      exit(1);
   }
   return attr_wrapper::get_attribute<std::string>(doc, "data");
}